

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_twolevel.cpp
# Opt level: O3

void __thiscall
embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleMv<4>_>::
setupLargeBuildRefBuilder
          (BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleMv<4>_> *this,
          size_t objectID,TriangleMesh *mesh)

{
  long *plVar1;
  Builder *pBVar2;
  char cVar3;
  long lVar4;
  undefined8 *puVar5;
  anon_struct_4_6_abad0318_for_Geometry_10 aVar6;
  Builder *builder;
  Builder *local_38;
  
  if ((((*(long *)(*(long *)(*(long *)(this + 0x28) + 0x200) + objectID * 8) != 0) &&
       (plVar1 = *(long **)(*(long *)(this + 0x10) + objectID * 8),
       cVar3 = (**(code **)(*plVar1 + 0x18))
                         (plVar1,*(ushort *)&(mesh->super_Geometry).field_8.field_0x2 & 7),
       cVar3 == '\0')) && (lVar4 = *(long *)(*(long *)(this + 0x10) + objectID * 8), lVar4 != 0)) &&
     (lVar4 = __dynamic_cast(lVar4,&BVHNBuilderTwoLevel<4,embree::TriangleMesh,embree::TriangleMv<4>>
                                    ::RefBuilderBase::typeinfo,
                             &BVHNBuilderTwoLevel<4,embree::TriangleMesh,embree::TriangleMv<4>>::
                              RefBuilderLarge::typeinfo,0), lVar4 != 0)) {
    return;
  }
  local_38 = (Builder *)0x0;
  plVar1 = *(long **)(*(long *)(*(long *)(this + 0x28) + 0x200) + objectID * 8);
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 8))();
  }
  createMeshAccel(this,objectID,&local_38);
  lVar4 = *(long *)(this + 0x10);
  puVar5 = (undefined8 *)operator_new(0x20);
  pBVar2 = local_38;
  if (local_38 == (Builder *)0x0) {
    aVar6 = (mesh->super_Geometry).field_8;
    *puVar5 = &PTR__RefBuilderLarge_0218f9d0;
    puVar5[1] = objectID;
    puVar5[2] = 0;
  }
  else {
    (*(local_38->super_RefCount)._vptr_RefCount[2])(local_38);
    aVar6 = (mesh->super_Geometry).field_8;
    *puVar5 = &PTR__RefBuilderLarge_0218f9d0;
    puVar5[1] = objectID;
    puVar5[2] = pBVar2;
    (*(pBVar2->super_RefCount)._vptr_RefCount[2])(pBVar2);
  }
  *(uint *)(puVar5 + 3) = (uint)aVar6 >> 0x10 & 7;
  plVar1 = *(long **)(lVar4 + objectID * 8);
  *(undefined8 **)(lVar4 + objectID * 8) = puVar5;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 8))();
  }
  if (pBVar2 != (Builder *)0x0) {
    (*(pBVar2->super_RefCount)._vptr_RefCount[3])(pBVar2);
  }
  return;
}

Assistant:

void BVHNBuilderTwoLevel<N,Mesh,Primitive>::setupLargeBuildRefBuilder (size_t objectID, Mesh const * const mesh)
    {
      if (bvh->objects[objectID] == nullptr ||                                  // new mesh
          builders[objectID]->meshQualityChanged (mesh->quality) ||             // changed build quality
          dynamic_cast<RefBuilderLarge*>(builders[objectID].get()) == nullptr)  // size change resulted in small->large change
      {
        Builder* builder = nullptr;
        delete bvh->objects[objectID]; 
        createMeshAccel(objectID, builder);
        builders[objectID].reset (new RefBuilderLarge(objectID, builder, mesh->quality));
      }
    }